

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_metadata_info.cpp
# Opt level: O2

void duckdb::PragmaMetadataInfo::RegisterFunction(BuiltinFunctions *set)

{
  vector<duckdb::TableFunction,_true> *this;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_449;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_448;
  LogicalType local_428;
  string local_410;
  TableFunctionSet metadata_info;
  FunctionSet<duckdb::TableFunction> local_3b8;
  TableFunction local_380;
  TableFunction local_1c8;
  
  ::std::__cxx11::string::string
            ((string *)&local_410,"pragma_metadata_info",(allocator *)&local_448);
  TableFunctionSet::TableFunctionSet(&metadata_info,&local_410);
  ::std::__cxx11::string::~string((string *)&local_410);
  local_448.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableFunction::TableFunction
            (&local_1c8,(vector<duckdb::LogicalType,_true> *)&local_448,PragmaMetadataInfoFunction,
             PragmaMetadataInfoBind,PragmaMetadataInfoInit,(table_function_init_local_t)0x0);
  this = &metadata_info.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_1c8);
  TableFunction::~TableFunction(&local_1c8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_448);
  LogicalType::LogicalType(&local_428,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_428;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_448,__l,&local_449);
  TableFunction::TableFunction
            (&local_380,(vector<duckdb::LogicalType,_true> *)&local_448,PragmaMetadataInfoFunction,
             PragmaMetadataInfoBind,PragmaMetadataInfoInit,(table_function_init_local_t)0x0);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_380);
  TableFunction::~TableFunction(&local_380);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_448);
  LogicalType::~LogicalType(&local_428);
  FunctionSet<duckdb::TableFunction>::FunctionSet
            (&local_3b8,&metadata_info.super_FunctionSet<duckdb::TableFunction>);
  BuiltinFunctions::AddFunction(set,(TableFunctionSet *)&local_3b8);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_3b8);
  FunctionSet<duckdb::TableFunction>::~FunctionSet
            (&metadata_info.super_FunctionSet<duckdb::TableFunction>);
  return;
}

Assistant:

void PragmaMetadataInfo::RegisterFunction(BuiltinFunctions &set) {
	TableFunctionSet metadata_info("pragma_metadata_info");
	metadata_info.AddFunction(
	    TableFunction({}, PragmaMetadataInfoFunction, PragmaMetadataInfoBind, PragmaMetadataInfoInit));
	metadata_info.AddFunction(TableFunction({LogicalType::VARCHAR}, PragmaMetadataInfoFunction, PragmaMetadataInfoBind,
	                                        PragmaMetadataInfoInit));
	set.AddFunction(metadata_info);
}